

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  string *psVar4;
  ostream *poVar5;
  allocator<char> local_49;
  string local_48;
  
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == STATIC_LIBRARY) {
    pcVar3 = cmTarget::GetMakefile(this->Target->Target);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"APPLE",&local_49);
    bVar1 = cmMakefile::IsOn(pcVar3,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      pcVar3 = cmTarget::GetMakefile(this->Target->Target);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"CMAKE_RANLIB",&local_49);
      psVar4 = cmMakefile::GetRequiredDefinition(pcVar3,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      if (psVar4->_M_string_length != 0) {
        poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar5 = std::operator<<(poVar5,"execute_process(COMMAND \"");
        poVar5 = std::operator<<(poVar5,(string *)psVar4);
        poVar5 = std::operator<<(poVar5,"\" \"");
        poVar5 = std::operator<<(poVar5,(string *)toDestDirPath);
        std::operator<<(poVar5,"\")\n");
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRanlibRule(std::ostream& os, Indent indent,
                                             const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    return;
  }

  // Perform post-installation processing on the file depending
  // on its type.
  if (!this->Target->Target->GetMakefile()->IsOn("APPLE")) {
    return;
  }

  const std::string& ranlib =
    this->Target->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if (ranlib.empty()) {
    return;
  }

  os << indent << "execute_process(COMMAND \"" << ranlib << "\" \""
     << toDestDirPath << "\")\n";
}